

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,string *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  undefined3 in_register_00000009;
  allocator<char> local_49;
  string local_48;
  
  this_00 = AddNewTarget(this,EXECUTABLE,exeName);
  if (CONCAT31(in_register_00000009,excludeFromAll) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    cmTarget::SetProperty(this_00,&local_48,"TRUE");
    std::__cxx11::string::~string((string *)&local_48);
  }
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const std::string& exeName,
                                    const std::vector<std::string>& srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::EXECUTABLE, exeName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}